

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

HighsStatus __thiscall
HighsSparseMatrix::assessIndexBounds(HighsSparseMatrix *this,HighsLogOptions *log_options)

{
  uint uVar1;
  uint uVar2;
  HighsInt HVar3;
  ulong uVar4;
  
  uVar1 = (&this->num_col_)[this->format_ == kColwise];
  HVar3 = numNz(this);
  uVar4 = 1;
  do {
    if ((long)HVar3 <= (long)uVar4) {
LAB_00361587:
      return -(uint)((long)uVar4 < (long)HVar3);
    }
    uVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) {
      highsLogUser(log_options,kError,"Matrix index[%d] = %d is not in legal range of [0, %d)\n",
                   uVar4 & 0xffffffff,(ulong)uVar2,(ulong)uVar1);
      goto LAB_00361587;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

HighsStatus HighsSparseMatrix::assessIndexBounds(
    const HighsLogOptions& log_options) {
  // Identify main dimensions
  HighsInt vec_dim;
  HighsInt num_vec;
  if (this->isColwise()) {
    vec_dim = this->num_row_;
    //    num_vec = this->num_col_;
  } else {
    vec_dim = this->num_col_;
    //    num_vec = this->num_row_;
  }
  HighsInt num_nz = this->numNz();
  for (HighsInt iEl = 1; iEl < num_nz; iEl++) {
    if (this->index_[iEl] < 0 || this->index_[iEl] >= vec_dim) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix index[%d] = %d is not in legal range of [0, %d)\n",
                   int(iEl), int(this->index_[iEl]), vec_dim);
      return HighsStatus::kError;
    }
  }
  return HighsStatus::kOk;
}